

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::~UEFITool(UEFITool *this)

{
  FfsBuilder *pFVar1;
  FfsOperations *pFVar2;
  FfsFinder *pFVar3;
  FfsParser *this_00;
  Data *pDVar4;
  
  *(undefined ***)this = &PTR_metaObject_002b1028;
  *(undefined ***)&this->field_0x10 = &PTR__UEFITool_002b11e0;
  pFVar1 = this->ffsBuilder;
  if (pFVar1 != (FfsBuilder *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector((vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
               *)(pFVar1 + 8));
  }
  operator_delete(pFVar1,0x20);
  pFVar2 = this->ffsOps;
  if (pFVar2 != (FfsOperations *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&pFVar2->messagesVector);
  }
  operator_delete(pFVar2,0x20);
  pFVar3 = this->ffsFinder;
  if (pFVar3 != (FfsFinder *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&pFVar3->messagesVector);
  }
  operator_delete(pFVar3,0x20);
  this_00 = this->ffsParser;
  if (this_00 != (FfsParser *)0x0) {
    FfsParser::~FfsParser(this_00);
  }
  operator_delete(this_00,200);
  operator_delete(this->ffsReport,8);
  if (this->model != (TreeModel *)0x0) {
    (**(code **)(*(long *)this->model + 0x20))();
  }
  if (this->hexViewDialog != (HexViewDialog *)0x0) {
    (**(code **)(*(long *)this->hexViewDialog + 0x20))();
  }
  if (this->searchDialog != (SearchDialog *)0x0) {
    (**(code **)(*(long *)this->searchDialog + 0x20))();
  }
  operator_delete(this->ui,600);
  pDVar4 = (this->version).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->version).d.d)->super_QArrayData,2,8);
    }
  }
  QFont::~QFont(&this->currentFont);
  pDVar4 = (this->currentProgramPath).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->currentProgramPath).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar4 = (this->currentPath).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->currentPath).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar4 = (this->currentDir).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->currentDir).d.d)->super_QArrayData,2,8);
    }
  }
  QMainWindow::~QMainWindow(&this->super_QMainWindow);
  return;
}

Assistant:

UEFITool::~UEFITool()
{
    delete ffsBuilder;
    delete ffsOps;
    delete ffsFinder;
    delete ffsParser;
    delete ffsReport;
    delete model;
    delete hexViewDialog;
    delete searchDialog;
    delete ui;
}